

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  float *pfVar1;
  int iVar2;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar3;
  ostream *poVar4;
  ssize_t sVar5;
  Scalar *pSVar6;
  ulong uVar7;
  void *__buf;
  long lVar8;
  char *pcVar9;
  float *j_max_limits_00;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  float fVar13;
  float current [3];
  float start_waypoint [3];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  Waypoints;
  float next_waypoint [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> current_position;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commanded_position;
  vector<float,_std::allocator<float>_> p1_1;
  vector<float,_std::allocator<float>_> p1;
  float j_max_limits [3];
  float j_min_limits [3];
  MatrixXd m1;
  Connection s1;
  Robot R1;
  char input_file [60];
  undefined8 local_270;
  float local_268;
  float local_264;
  Scalar local_260;
  undefined8 local_258;
  float local_250;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_248;
  float local_224;
  float local_220;
  float local_21c;
  Scalar local_218;
  float local_210;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  vector<float,_std::allocator<float>_> local_1c8;
  vector<float,_std::allocator<float>_> local_1b0;
  float local_198 [4];
  float local_188 [4];
  DenseStorage<double,__1,__1,__1,_0> local_178;
  Connection local_158;
  DenseStorage<double,__1,__1,__1,_0> local_130;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Robot local_f8;
  char local_78 [72];
  
  local_248.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188[0] = -3.1415927;
  local_188[1] = -1.5707964;
  local_188[2] = -3.1415927;
  local_198[0] = 3.1415927;
  local_198[1] = 1.5707964;
  local_198[2] = 3.1415927;
  builtin_strncpy(local_78 + 0x20,"tracking/input.txt",0x13);
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  builtin_strncpy(local_78 + 0x10,"t_Ik_trajectory_",0x10);
  builtin_strncpy(local_78,"/home/gokul/Robo",0x10);
  trajectory_waypoints
            ((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)&local_158,local_78);
  local_f8.Dh_params.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = (Index)local_248.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f8.Dh_params.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)
           local_248.
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_f8._0_8_ =
       local_248.
       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_248.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_158._0_8_;
  local_248.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_158.buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_248.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_158.buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_158._0_8_ = (pointer)0x0;
  local_158.buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)&local_f8);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)&local_158);
  local_178.m_cols = 0;
  local_178.m_data = (double *)0x0;
  local_178.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_178,0xc,3,4);
  local_f8.Dh_params.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  local_f8.Dh_params.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 1;
  local_f8.Dh_params.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 1;
  *local_178.m_data = 1.5707963267948966;
  local_158._0_8_ = (pointer)0x4024000000000000;
  local_f8._0_8_ = &local_178;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_f8,
                      (Scalar *)&local_158);
  local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&local_1b0);
  local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&local_1c8);
  local_270 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&local_270);
  local_258 = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&local_258);
  local_218 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_218);
  local_260 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_260);
  local_100 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_100);
  local_108 = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_108);
  local_110 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_110);
  local_118 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar3,&local_118);
  if ((((long)local_f8.Dh_params.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data +
        local_f8.Dh_params.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols != *(Index *)(local_f8._0_8_ + 8)) &&
      (*(Index *)(local_f8._0_8_ + 0x10) != 0)) ||
     ((pointer)local_f8.Dh_params.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows != *(pointer *)(local_f8._0_8_ + 0x10))) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gokul-gokz[P]Robot_trajectory_tracking/include/Eigen/src/Core/CommaInitializer.h"
                  ,0x78,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_130,&local_178);
  j_max_limits_00 = local_198;
  Robot::Robot(&local_f8,3,(MatrixXd *)&local_130,local_188,j_max_limits_00);
  free(local_130.m_data);
  Connection::Connection(&local_158,3);
  local_268 = 0.0;
  local_270 = 0.0;
  pfVar1 = ((local_248.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_258._0_4_ = *pfVar1;
  local_258._4_4_ = pfVar1[1];
  local_250 = pfVar1[2];
  poVar4 = std::ostream::_M_insert<double>((double)(float)local_258);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = std::ostream::_M_insert<double>((double)local_258._4_4_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = std::ostream::_M_insert<double>((double)local_250);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  Robot::closest_IK_solutions(&local_1b0,&local_f8,(float *)&local_270,(float *)&local_258);
  local_270._0_4_ =
       *local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start;
  local_270._4_4_ =
       local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start[1];
  local_268 = local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[2];
  if (1 < (ulong)(((long)local_248.
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_248.
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    uVar10 = 1;
    do {
      local_264 = local_248.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10].
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start[3] * 50.0;
      pSVar6 = (Scalar *)
               local_248.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start;
      local_218 = *pSVar6;
      local_210 = *(float *)(pSVar6 + 1);
      pSVar6 = &local_218;
      Robot::closest_IK_solutions(&local_1c8,&local_f8,(float *)&local_270,(float *)pSVar6);
      if (0.0 < local_264) {
        local_21c = (*local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start - (float)local_270) / local_264;
        local_220 = (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[1] - local_270._4_4_) / local_264;
        local_224 = (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[2] - local_268) / local_264;
        iVar11 = 1;
        do {
          iVar2 = Connection::receive(&local_158,&local_208);
          if (iVar2 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Unable to read the current position",0x23);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
            std::ostream::put('\b');
            std::ostream::flush();
            break;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Current position received successfully",0x26);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
          std::ostream::put('\b');
          std::ostream::flush();
          local_270._0_4_ = (float)local_270 + local_21c;
          local_270._4_4_ = local_270._4_4_ + local_220;
          local_268 = local_268 + local_224;
          local_260._0_1_ = (char)(int)(float)local_270;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&local_1e8,(uchar *)&local_260);
          local_260._0_1_ = (undefined1)(int)local_270._4_4_;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&local_1e8,(uchar *)&local_260);
          local_260 = (Scalar)CONCAT71(local_260._1_7_,(char)(int)local_268);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&local_1e8,(uchar *)&local_260);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Waypoint ",9);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,":Joint_angles",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          poVar4 = std::ostream::_M_insert<double>((double)(float)local_270);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          poVar4 = std::ostream::_M_insert<double>((double)local_270._4_4_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          poVar4 = std::ostream::_M_insert<double>((double)local_268);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          sVar5 = Connection::send(&local_158,(int)&local_1e8,__buf,(size_t)pSVar6,
                                   (int)j_max_limits_00);
          bVar12 = (int)sVar5 == 0;
          pcVar9 = "Commanded successfully";
          if (bVar12) {
            pcVar9 = "Socket communication failure";
          }
          lVar8 = 0x16;
          if (bVar12) {
            lVar8 = 0x1c;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar8);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
          std::ostream::put('\b');
          std::ostream::flush();
          fVar13 = (float)iVar11;
          iVar11 = iVar11 + 1;
        } while (fVar13 < local_264);
      }
      if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar10 = uVar10 + 1;
      uVar7 = ((long)local_248.
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_248.
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
  }
  if (local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Connection::~Connection(&local_158);
  Robot::~Robot(&local_f8);
  free(local_178.m_data);
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_248);
  return 0;
}

Assistant:

int main() {
    // Vector for extracting the waypoints
    std::vector<std::vector<float> > Waypoints;
    std::vector<unsigned char > commanded_position;
    std::vector<unsigned char > current_position;

    bool is_running = true;

    //Assign the joint limits
    float j_min_limits[3] = {-M_PI, -M_PI / 2, -M_PI};
    float j_max_limits[3] = {M_PI, M_PI / 2, M_PI};

    //Location of the file which has the trajectory
    char input_file[60] = "/home/gokul/Robot_Ik_trajectory_tracking/input.txt";
    float t = 0;
    Waypoints = trajectory_waypoints(input_file);

    //Create an Eigen matrix to store the DH parameters
    Eigen::MatrixXd m1(3, 4);
    m1 << M_PI / 2, 10, 0, 0, 0, 5, 0, 0, 0, 5, 0, 0;

    //Initialize the robot with DH param and joint limits
    Robot R1(3, m1, j_min_limits, j_max_limits);

    //Create a connection with packet data size 3(three angles)
    Connection s1(3);

    //Command the robot to the start point of the trajectory
    float current[] = {0, 0, 0};

    //Extract the start point of trajectory
    float start_waypoint[] = {Waypoints[0][0], Waypoints[0][1], Waypoints[0][2]};
    std::cout<<start_waypoint[0]<<std::endl;
    std::cout<<start_waypoint[1]<<std::endl;
    std::cout<<start_waypoint[2]<<std::endl;

    //Initialize joint angle increment
    float joint_angle_increment[] = {0, 0, 0};

    //Find the joint angles for the start position
    std::vector<float> p1 = R1.closest_IK_solutions(current,start_waypoint) ;

    //Assign the start position
    current[0]=p1[0];
    current[1]=p1[1];
    current[2]=p1[2];

    //Joint space trajectory control
    //Follow the trajectory
    for (int i = 1; i < Waypoints.size(); i++) {
        float t_prev = t;
        float t = Waypoints[i][3];
        float time_step = (t - t_prev) * 50;
        float next_waypoint[] = {Waypoints[i][0], Waypoints[i][1], Waypoints[i][2]};

        //Extract the joint angles of the waypoints
        std::vector<float> p1 = R1.closest_IK_solutions(current, next_waypoint);

        //Find the joint angle increment based on the time between 2 waypoints
        //Assuming that the robot is always able to go to the commanded position in the specific time
        joint_angle_increment[0] = (p1[0] - current[0]) / time_step;
        joint_angle_increment[1] = (p1[1] - current[1]) / time_step;
        joint_angle_increment[2] = (p1[2] - current[2]) / time_step;

        for(int j=0;j<time_step;j++) {

            // Receive the current position from the robot
            if(s1.receive(current_position))
                std::cout<<"Current position received successfully"<<std::endl;
            else
            {
                std::cout<<"Unable to read the current position"<<std::endl;
                break;
            }

            //Increment the current position
            current[0] = current[0] + joint_angle_increment[0];
            current[1] = current[1] + joint_angle_increment[1];
            current[2] = current[2] + joint_angle_increment[2];

            commanded_position.push_back(current[0]);
            commanded_position.push_back(current[1]);
            commanded_position.push_back(current[2]);

            std::cout << "Waypoint " << i << ":Joint_angles" << std::endl;
            std::cout << current[0] << std::endl;
            std::cout << current[1] << std::endl;
            std::cout << current[2] << std::endl;

            //Send the calculated joint angle through the socket
            if(s1.send(commanded_position))
            {
                cout<<"Commanded successfully"<<std::endl;
            } else
            {
                cout<<"Socket communication failure"<<std::endl;
            }

        }
    }

    return 0;

}